

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O0

void __thiscall r_exec::RMonitor::update(RMonitor *this,uint64_t *next_target)

{
  MDLController *pMVar1;
  Fact *pFVar2;
  ulong uVar3;
  uint64_t *next_target_local;
  RMonitor *this_local;
  
  pFVar2 = core::P<r_exec::Fact>::operator->
                     (&(this->super_GMonitor).super__GMonitor.super_Monitor.target);
  uVar3 = (**(code **)((long)(pFVar2->super__Fact).super_LObject.
                             super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code
                             .super__Object._vptr__Object + 0x70))();
  if ((uVar3 & 1) == 0) {
    if ((this->super_GMonitor).super__GMonitor.simulating == 0) {
      pMVar1 = (this->super_GMonitor).super__GMonitor.super_Monitor.controller;
      pFVar2 = core::P::operator_cast_to_Fact_
                         ((P *)&(this->super_GMonitor).super__GMonitor.super_Monitor.target);
      (*(pMVar1->super_HLPController).super_OController.super_Controller.super__Object._vptr__Object
        [0xf])(pMVar1,pFVar2,0,0);
      PMDLController::remove_r_monitor
                ((PMDLController *)(this->super_GMonitor).super__GMonitor.super_Monitor.controller,
                 (_GMonitor *)this);
      *next_target = 0;
    }
    else {
      (this->super_GMonitor).super__GMonitor.simulating = 0;
      GMonitor::commit(&this->super_GMonitor);
      *next_target = (this->super_GMonitor).super__GMonitor.deadline;
    }
  }
  else {
    PMDLController::remove_r_monitor
              ((PMDLController *)(this->super_GMonitor).super__GMonitor.super_Monitor.controller,
               (_GMonitor *)this);
    *next_target = 0;
  }
  return;
}

Assistant:

void RMonitor::update(uint64_t &next_target)
{
    if (target->is_invalidated()) {
        ((PMDLController *)controller)->remove_r_monitor(this);
        next_target = 0;
    } else if (simulating) {
        simulating = 0;
        commit();
        next_target = deadline;
    } else {
        ((PMDLController *)controller)->register_goal_outcome(target, false, nullptr);
        ((PMDLController *)controller)->remove_r_monitor(this);
        next_target = 0;
    }
}